

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O0

bool __thiscall
tchecker::system::process_events_map_t::contains
          (process_events_map_t *this,process_id_t pid,event_id_t event_id)

{
  size_type sVar1;
  reference k;
  undefined1 local_30 [16];
  event_id_t local_20;
  uint local_1c;
  event_id_t event_id_local;
  process_id_t pid_local;
  process_events_map_t *this_local;
  
  local_20 = event_id;
  local_1c = pid;
  _event_id_local = this;
  sVar1 = std::
          vector<boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>_>
          ::size(&this->_map);
  if (pid < sVar1) {
    k = std::
        vector<boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>_>
        ::operator[](&this->_map,(ulong)local_1c);
    boost::container::dtl::
    flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
    ::find((flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
            *)(local_30 + 8),(key_type *)k);
    std::
    vector<boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>_>
    ::operator[](&this->_map,(ulong)local_1c);
    boost::container::dtl::
    flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
    ::end((flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
           *)local_30);
    this_local._7_1_ =
         boost::container::operator!=
                   ((vec_iterator<unsigned_int_*,_false> *)(local_30 + 8),
                    (vec_iterator<unsigned_int_*,_false> *)local_30);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool process_events_map_t::contains(tchecker::process_id_t pid, tchecker::event_id_t event_id)
{
  if (pid >= _map.size())
    return false;
  return (_map[pid].find(event_id) != _map[pid].end());
}